

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O1

int __thiscall
CVmObjStrComp::getp_calc_hash(CVmObjStrComp *this,vm_obj_id_t param_1,vm_val_t *retval,uint *argc)

{
  int iVar1;
  ushort *puVar2;
  
  if (getp_calc_hash(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_calc_hash();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_calc_hash::desc);
  if (iVar1 == 0) {
    puVar2 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar2 == (ushort *)0x0) {
      err_throw(0x900);
    }
    iVar1 = (*(this->super_CVmObject)._vptr_CVmObject[0x3b])(this,puVar2 + 1,(ulong)*puVar2);
    retval->typ = VM_INT;
    (retval->val).intval = iVar1;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjStrComp::getp_calc_hash(VMG_ vm_obj_id_t /*self*/,
                                  vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    const char *strp;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   retrieve the string argument (it must be a string), but leave it on
     *   the stack for now, for gc protection 
     */
    strp = G_stk->get(0)->get_as_string(vmg0_);
    if (strp == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* calculate the hash value and return it */
    retval->set_int(calc_str_hash(strp + VMB_LEN, vmb_get_len(strp)));

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}